

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<short>,_void>::visit
          (ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<short>,_void> *this,Arg *arg)

{
  int iVar1;
  int iVar2;
  ushort uVar3;
  uint uVar4;
  uint *puVar5;
  
  switch(arg->type) {
  case INT:
  case CHAR:
    anon_unknown_1::ArgConverter<short>::visit_any_int<int>
              ((ArgConverter<short> *)this,(arg->super_Value).field_0.int_value);
    return;
  case UINT:
    uVar3 = *(ushort *)&(arg->super_Value).field_0;
    uVar4 = (uint)uVar3;
    if ((*(int *)(this + 8) == 0x69) || (*(int *)(this + 8) == 100)) {
      puVar5 = *(uint **)this;
      puVar5[4] = 2;
      uVar4 = (uint)(short)uVar3;
    }
    else {
      puVar5 = *(uint **)this;
      puVar5[4] = 3;
    }
    break;
  case LONG_LONG:
  case ULONG_LONG:
    uVar3 = (ushort)(arg->super_Value).field_0.long_long_value;
    if ((*(int *)(this + 8) == 0x69) || (*(int *)(this + 8) == 100)) {
      puVar5 = *(uint **)this;
      puVar5[4] = 2;
      uVar4 = (uint)(short)uVar3;
    }
    else {
      puVar5 = *(uint **)this;
      puVar5[4] = 3;
      uVar4 = (uint)uVar3;
    }
    break;
  case BOOL:
    iVar1 = *(int *)(this + 8);
    if (iVar1 != 0x73) {
      iVar2 = (arg->super_Value).field_0.int_value;
      puVar5 = *(uint **)this;
      puVar5[4] = (iVar1 == 100 || iVar1 == 0x69) ^ 3;
      *puVar5 = (uint)(iVar2 != 0);
      return;
    }
  default:
    goto switchD_0013a2eb_default;
  }
  *puVar5 = uVar4;
switchD_0013a2eb_default:
  return;
}

Assistant:

Result visit(const Arg &arg) {
    switch (arg.type) {
    case Arg::NONE:
    case Arg::NAMED_ARG:
      FMT_ASSERT(false, "invalid argument type");
      break;
    case Arg::INT:
      return FMT_DISPATCH(visit_int(arg.int_value));
    case Arg::UINT:
      return FMT_DISPATCH(visit_uint(arg.uint_value));
    case Arg::LONG_LONG:
      return FMT_DISPATCH(visit_long_long(arg.long_long_value));
    case Arg::ULONG_LONG:
      return FMT_DISPATCH(visit_ulong_long(arg.ulong_long_value));
    case Arg::BOOL:
      return FMT_DISPATCH(visit_bool(arg.int_value != 0));
    case Arg::CHAR:
      return FMT_DISPATCH(visit_char(arg.int_value));
    case Arg::DOUBLE:
      return FMT_DISPATCH(visit_double(arg.double_value));
    case Arg::LONG_DOUBLE:
      return FMT_DISPATCH(visit_long_double(arg.long_double_value));
    case Arg::CSTRING:
      return FMT_DISPATCH(visit_cstring(arg.string.value));
    case Arg::STRING:
      return FMT_DISPATCH(visit_string(arg.string));
    case Arg::WSTRING:
      return FMT_DISPATCH(visit_wstring(arg.wstring));
    case Arg::POINTER:
      return FMT_DISPATCH(visit_pointer(arg.pointer));
    case Arg::CUSTOM:
      return FMT_DISPATCH(visit_custom(arg.custom));
    }
    return Result();
  }